

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

State __thiscall QSpinBoxValidator::validate(QSpinBoxValidator *this,QString *input,int *pos)

{
  bool bVar1;
  char cVar2;
  State SVar3;
  QAbstractSpinBoxPrivate *pQVar4;
  
  pQVar4 = this->dptr;
  if ((pQVar4->specialValueText).d.size != 0) {
    bVar1 = ::comparesEqual(input,&pQVar4->specialValueText);
    if (bVar1) {
      return Acceptable;
    }
    pQVar4 = this->dptr;
  }
  if ((pQVar4->prefix).d.size != 0) {
    cVar2 = QString::startsWith((QString *)input,(int)pQVar4 + 600);
    pQVar4 = this->dptr;
    if (cVar2 == '\0') {
      QString::prepend(input,&pQVar4->prefix);
      pQVar4 = this->dptr;
      *pos = *pos + (int)(pQVar4->prefix).d.size;
    }
  }
  if ((pQVar4->suffix).d.size != 0) {
    cVar2 = QString::endsWith((QString *)input,(int)pQVar4 + 0x270);
    if (cVar2 == '\0') {
      QString::append((QString *)input);
    }
  }
  SVar3 = (**(code **)(*(long *)&this->qptr->super_QWidget + 0x1a0))(this->qptr,input,pos);
  return SVar3;
}

Assistant:

QValidator::State QSpinBoxValidator::validate(QString &input, int &pos) const
{
    if (dptr->specialValueText.size() > 0 && input == dptr->specialValueText)
        return QValidator::Acceptable;

    if (!dptr->prefix.isEmpty() && !input.startsWith(dptr->prefix)) {
        input.prepend(dptr->prefix);
        pos += dptr->prefix.size();
    }

    if (!dptr->suffix.isEmpty() && !input.endsWith(dptr->suffix))
        input.append(dptr->suffix);

    return qptr->validate(input, pos);
}